

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O2

void __thiscall
TPZEulerAnalysis::UpdateSolAndRhs<double>
          (TPZEulerAnalysis *this,TPZFMatrix<double> *deltaSol,REAL *epsilon)

{
  TPZSolutionMatrix *this_00;
  double dVar1;
  TPZFMatrix<double> *this_01;
  TPZFMatrix<double> *sol0;
  TPZSolutionMatrix *residual;
  STATE SVar2;
  
  this_00 = &(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution;
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
  dVar1 = *epsilon;
  TPZFMatrix<double>::operator+=(this_01,&deltaSol->super_TPZMatrix<double>);
  TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x22])(this)
  ;
  SVar2 = Norm(&(this->super_TPZLinearAnalysis).fRhs);
  *epsilon = SVar2;
  if (dVar1 < SVar2) {
    TPZFMatrix<double>::operator-=(this_01,&deltaSol->super_TPZMatrix<double>);
    residual = this_00;
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    sol0 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(this_00);
    LineSearch(this,(REAL *)residual,sol0,deltaSol);
    TPZFMatrix<double>::operator+=(this_01,&deltaSol->super_TPZMatrix<double>);
    TPZCompMesh::LoadSolution((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh,this_00);
    SVar2 = Norm(&(this->super_TPZLinearAnalysis).fRhs);
    *epsilon = SVar2;
  }
  return;
}

Assistant:

void TPZEulerAnalysis::UpdateSolAndRhs(TPZFMatrix<TVar> & deltaSol, REAL & epsilon)
{
	TPZFMatrix<TVar> &sol = fSolution;
    REAL initEpsilon = epsilon;
    int outofrange = 0;
    try
    {
        sol += deltaSol;
        fCompMesh->LoadSolution(fSolution);
        AssembleRhs();
        epsilon = Norm(fRhs);
    }
	catch(...)
	{
		outofrange = 1;
		sol -= deltaSol;
		epsilon = initEpsilon;
		fCompMesh->LoadSolution(fSolution);
	}
	
    if(epsilon > initEpsilon)
    {
		sol -= deltaSol;
		fCompMesh->LoadSolution(fSolution);
		/*int resultlin = */
		LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
    }
	
    if(outofrange)
    {
		/*int resultlin = */LineSearch(initEpsilon ,fSolution, deltaSol);
		sol += deltaSol;
		fCompMesh->LoadSolution(fSolution);
		epsilon = Norm(fRhs);
		fFlowCompMesh->ScaleCFL(.5);
    }
}